

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O2

void dg::pta::dumpNode(PSNode *nd,string *errors)

{
  PSNode *pPVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  allocator local_d9;
  PSNode *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = PSNodeTypeToCString(nd->type);
  std::__cxx11::string::string((string *)&local_d0,pcVar2,&local_d9);
  std::operator+(&local_70,&local_d0," with ID ");
  std::__cxx11::to_string(&local_90,(nd->super_SubgraphNode<dg::pta::PSNode>).id);
  std::operator+(&local_b0,&local_70,&local_90);
  std::operator+(&local_50,&local_b0,"\n  - operands: [");
  std::__cxx11::string::append((string *)errors);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  uVar3 = (ulong)((long)(nd->super_SubgraphNode<dg::pta::PSNode>).operands.
                        super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(nd->super_SubgraphNode<dg::pta::PSNode>).operands.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  local_d8 = nd;
  for (uVar4 = 0; (uVar3 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
    pPVar1 = (local_d8->super_SubgraphNode<dg::pta::PSNode>).operands.
             super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    std::__cxx11::to_string(&local_50,(pPVar1->super_SubgraphNode<dg::pta::PSNode>).id);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((string *)errors);
    std::__cxx11::string::_M_dispose();
    pcVar2 = PSNodeTypeToCString(pPVar1->type);
    std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&local_b0);
    std::__cxx11::string::append((string *)errors);
    std::__cxx11::string::_M_dispose();
    if ((int)uVar3 - 1 != uVar4) {
      std::__cxx11::string::append((char *)errors);
    }
  }
  std::__cxx11::string::append((char *)errors);
  return;
}

Assistant:

static void dumpNode(const PSNode *nd, std::string &errors) {
    errors += std::string(PSNodeTypeToCString(nd->getType())) + " with ID " +
              std::to_string(nd->getID()) + "\n  - operands: [";
    for (unsigned i = 0, e = nd->getOperandsNum(); i < e; ++i) {
        const PSNode *op = nd->getOperand(i);
        errors += std::to_string(op->getID()) += " ";
        errors += std::string(PSNodeTypeToCString(op->getType()));
        if (i != e - 1)
            errors += ", ";
    }
    errors += "]\n";
}